

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
          (RepeatedPtrFieldBase *this)

{
  int v1;
  int v2;
  LogMessage *pLVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *value;
  long lVar2;
  undefined1 auVar3 [16];
  LogMessageFatal local_48 [23];
  Voidify local_31;
  string *local_30;
  string *absl_log_internal_check_op_result;
  void **ppvStack_20;
  int i;
  void **elems;
  RepeatedPtrFieldBase *pRStack_10;
  int n;
  RepeatedPtrFieldBase *this_local;
  
  elems._4_4_ = this->current_size_;
  pRStack_10 = this;
  ppvStack_20 = elements(this);
  absl_log_internal_check_op_result._4_4_ = 0;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue(elems._4_4_);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_30 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_(v1,v2,"n > 0");
  if (local_30 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x2a8,auVar3._0_8_,auVar3._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  local_30 = (string *)0x0;
  do {
    lVar2 = (long)absl_log_internal_check_op_result._4_4_;
    absl_log_internal_check_op_result._4_4_ = absl_log_internal_check_op_result._4_4_ + 1;
    value = cast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                      (ppvStack_20[lVar2]);
    GenericTypeHandler<google::protobuf::MessageLite>::Clear(value);
  } while (absl_log_internal_check_op_result._4_4_ < elems._4_4_);
  ExchangeCurrentSize(this,0);
  return;
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }